

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffexts(char *extspec,int *extnum,char *extname,int *extvers,int *hdutype,char *imagecolname,
          char *rowexpress,int *status)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int *piVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  char *local_90;
  char *local_88;
  int *local_80;
  char tmpname [71];
  
  *extnum = 0;
  *extname = '\0';
  *extvers = 0;
  *hdutype = -1;
  *imagecolname = '\0';
  *rowexpress = '\0';
  if (0 < *status) {
    return *status;
  }
  pcVar12 = extspec + -1;
  do {
    cVar1 = pcVar12[1];
    pcVar12 = pcVar12 + 1;
  } while ((long)cVar1 == 0x20);
  local_88 = imagecolname;
  local_80 = hdutype;
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) == 0) {
LAB_00127dd4:
    sVar6 = strcspn(pcVar12,",:;");
    iVar2 = (int)sVar6;
    if (0x46 < iVar2) goto LAB_0012806f;
    strncat(extname,pcVar12,(long)iVar2);
    lVar11 = (long)iVar2;
    lVar5 = 0;
    while ((0 < (int)(sVar6 + lVar5) &&
           (uVar8 = sVar6 + lVar5 & 0xffffffff, extname[uVar8 - 1] == ' '))) {
      extname[uVar8 - 1] = '\0';
      lVar5 = lVar5 + -1;
      lVar11 = lVar11 + -1;
    }
    sVar6 = strspn(pcVar12 + lVar5 + iVar2," ,:");
    pcVar9 = pcVar12 + (int)sVar6 + lVar11;
    sVar7 = strcspn(pcVar9," ,:;");
    if ((int)sVar7 == 0) {
      strcpy(tmpname,extname);
      ffupch(tmpname);
      if (tmpname._0_8_ == 0x5952414d495250 || (short)tmpname._0_8_ == 0x50) {
        *extname = '\0';
      }
    }
    else {
      iVar2 = __isoc99_sscanf(pcVar9,"%d",extvers);
      if (iVar2 != 1) {
        ffpmsg("illegal EXTVER value in input URL:");
        ffpmsg(extspec);
        *status = 0x7d;
        return 0x7d;
      }
      lVar5 = (int)sVar6 + lVar11 + (long)(int)sVar7;
      sVar6 = strspn(pcVar12 + lVar5," ,:");
      lVar5 = (int)sVar6 + lVar5;
      pcVar9 = pcVar12 + lVar5;
      sVar6 = strcspn(pcVar9,";");
      if ((int)sVar6 != 0) {
        uVar8 = (ulong)((byte)pcVar12[lVar5] - 0x41);
        if (0x33 < (byte)pcVar12[lVar5] - 0x41) {
LAB_0012805a:
          pcVar12 = "unknown type of HDU in input URL:";
          goto LAB_00128061;
        }
        if ((0x8000100080001U >> (uVar8 & 0x3f) & 1) == 0) {
          if ((0x200000002U >> (uVar8 & 0x3f) & 1) == 0) {
            if ((0x10000000100U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_0012805a;
            *local_80 = 0;
          }
          else {
            *local_80 = 2;
          }
        }
        else {
          *local_80 = 1;
        }
      }
    }
LAB_00127f90:
    pcVar9 = strchr(pcVar9,0x3b);
    pcVar12 = pcVar9;
    if (pcVar9 == (char *)0x0) {
LAB_0012802a:
      return *status;
    }
    do {
      pcVar9 = pcVar9 + 1;
      pcVar10 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
    } while (*pcVar10 == ' ');
    pcVar10 = strchr(pcVar12,0x28);
    if (pcVar10 == (char *)0x0) {
      ffpmsg("illegal specification of image in table cell in input URL:");
      pcVar12 = " did not find a row expression enclosed in ( )";
    }
    else {
      if (0x400 < (long)pcVar10 - (long)pcVar9) goto LAB_0012806f;
      strncat(local_88,pcVar12,(long)pcVar10 - (long)pcVar9);
      pcVar12 = pcVar10;
      do {
        pcVar10 = pcVar10 + 1;
        pcVar9 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
      } while (*pcVar9 == ' ');
      pcVar9 = strchr(pcVar12,0x29);
      if (pcVar9 != (char *)0x0) {
        if ((long)pcVar9 - (long)pcVar10 < 0x401) {
          strncat(rowexpress,pcVar12,(long)pcVar9 - (long)pcVar10);
          goto LAB_0012802a;
        }
        goto LAB_0012806f;
      }
      ffpmsg("illegal specification of image in table cell in input URL:");
      pcVar12 = " missing closing \')\' character in row expression";
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(pcVar12,&local_90,10);
    *extnum = (uint)lVar5;
    for (; cVar1 = *local_90, cVar1 == ' '; local_90 = local_90 + 1) {
    }
    if (((cVar1 != '\0') && (cVar1 != ';')) || (*piVar4 == 0x22)) {
      *extnum = 0;
      *piVar4 = 0;
      if (99999 < (uint)*extnum) goto LAB_00127dc5;
      goto LAB_00127dd4;
    }
    pcVar9 = pcVar12;
    if ((uint)lVar5 < 100000) goto LAB_00127f90;
LAB_00127dc5:
    *extnum = 0;
    pcVar12 = "specified extension number is out of range:";
  }
LAB_00128061:
  ffpmsg(pcVar12);
  ffpmsg(extspec);
LAB_0012806f:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int ffexts(char *extspec, 
                       int *extnum, 
                       char *extname,
                       int *extvers,
                       int *hdutype,
                       char *imagecolname,
                       char *rowexpress,
                       int *status)
{
/*
   Parse the input extension specification string, returning either the
   extension number or the values of the EXTNAME, EXTVERS, and XTENSION
   keywords in desired extension. Also return the name of the column containing
   an image, and an expression to be used to determine which row to use,
   if present.
*/
    char *ptr1, *ptr2;
    int slen, nvals;
    int notint = 1; /* initially assume specified extname is not an integer */
    char tmpname[FLEN_VALUE], *loc;

    *extnum = 0;
    *extname = '\0';
    *extvers = 0;
    *hdutype = ANY_HDU;
    *imagecolname = '\0';
    *rowexpress = '\0';

    if (*status > 0)
        return(*status);

    ptr1 = extspec;       /* pointer to first char */

    while (*ptr1 == ' ')  /* skip over any leading blanks */
        ptr1++;

    if (isdigit((int) *ptr1))  /* is the extension specification a number? */
    {
        notint = 0;  /* looks like extname may actually be the ext. number */
        errno = 0;  /* reset this prior to calling strtol */
        *extnum = strtol(ptr1, &loc, 10);  /* read the string as an integer */

        while (*loc == ' ')  /* skip over trailing blanks */
           loc++;

        /* check for read error, or junk following the integer */
        if ((*loc != '\0' && *loc != ';' ) || (errno == ERANGE) )
        {
           *extnum = 0;
           notint = 1;  /* no, extname was not a simple integer after all */
           errno = 0;  /* reset error condition flag if it was set */
        }

        if ( *extnum < 0 || *extnum > 99999)
        {
            *extnum = 0;   /* this is not a reasonable extension number */
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }


/*  This logic was too simple, and failed on extnames like '1000TEMP' 
    where it would try to move to the 1000th extension

    if (isdigit((int) *ptr1))  
    {
        sscanf(ptr1, "%d", extnum);
        if (*extnum < 0 || *extnum > 9999)
        {
            *extnum = 0;   
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }
*/

    if (notint)
    {
           /* not a number, so EXTNAME must be specified, followed by */
           /* optional EXTVERS and XTENSION  values */

           /* don't use space char as end indicator, because there */
           /* may be imbedded spaces in the EXTNAME value */
           slen = strcspn(ptr1, ",:;");   /* length of EXTNAME */

	   if (slen > FLEN_VALUE - 1)
	   {
                return(*status = URL_PARSE_ERROR); 
           }
 
           strncat(extname, ptr1, slen);  /* EXTNAME value */

           /* now remove any trailing blanks */
           while (slen > 0 && *(extname + slen -1) == ' ')
           {
               *(extname + slen -1) = '\0';
               slen--;
           }

           ptr1 += slen;
           slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
           ptr1 += slen;

           slen = strcspn(ptr1, " ,:;");   /* length of EXTVERS */
           if (slen)
           {
               nvals = sscanf(ptr1, "%d", extvers);  /* EXTVERS value */
               if (nvals != 1)
               {
                   ffpmsg("illegal EXTVER value in input URL:");
                   ffpmsg(extspec);
                   return(*status = URL_PARSE_ERROR);
               }

               ptr1 += slen;
               slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
               ptr1 += slen;

               slen = strcspn(ptr1, ";");   /* length of HDUTYPE */
               if (slen)
               {
                 if (*ptr1 == 'b' || *ptr1 == 'B')
                     *hdutype = BINARY_TBL;  
                 else if (*ptr1 == 't' || *ptr1 == 'T' ||
                          *ptr1 == 'a' || *ptr1 == 'A')
                     *hdutype = ASCII_TBL;
                 else if (*ptr1 == 'i' || *ptr1 == 'I')
                     *hdutype = IMAGE_HDU;
                 else
                 {
                     ffpmsg("unknown type of HDU in input URL:");
                     ffpmsg(extspec);
                     return(*status = URL_PARSE_ERROR);
                 }
               }
           }
           else
           {
                strcpy(tmpname, extname);
                ffupch(tmpname);
                if (!strcmp(tmpname, "PRIMARY") || !strcmp(tmpname, "P") )
                    *extname = '\0';  /* return extnum = 0 */
           }
    }

    ptr1 = strchr(ptr1, ';');
    if (ptr1)
    {
        /* an image is to be opened; the image is contained in a single */
        /* cell of a binary table.  A column name and an expression to  */
        /* determine which row to use has been entered.                 */

        ptr1++;  /* skip over the ';' delimiter */
        while (*ptr1 == ' ')  /* skip over any leading blanks */
            ptr1++;

        ptr2 = strchr(ptr1, '(');
        if (!ptr2)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" did not find a row expression enclosed in ( )");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	{
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(imagecolname, ptr1, ptr2 - ptr1); /* copy column name */

        ptr2++;  /* skip over the '(' delimiter */
        while (*ptr2 == ' ')  /* skip over any leading blanks */
            ptr2++;


        ptr1 = strchr(ptr2, ')');
        if (!ptr1)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" missing closing ')' character in row expression");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr1 - ptr2 > FLEN_FILENAME - 1)
        {
                return(*status = URL_PARSE_ERROR); 
        }
 
        strncat(rowexpress, ptr2, ptr1 - ptr2); /* row expression */
    }

    return(*status);
}